

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnWriter::CompressPage
          (ColumnWriter *this,MemoryStream *temp_writer,size_t *compressed_size,
          data_ptr_t *compressed_data,AllocatedData *compressed_buf)

{
  int iVar1;
  size_t sVar2;
  idx_t iVar3;
  Allocator *pAVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  mz_ulong mVar8;
  InternalException *pIVar9;
  MiniZStream s;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8;
  mz_ulong mStack_a0;
  char *local_98;
  mz_internal_state *pmStack_90;
  mz_alloc_func local_88;
  mz_free_func p_Stack_80;
  void *local_78;
  undefined8 uStack_70;
  mz_ulong local_68;
  mz_ulong mStack_60;
  MiniZStreamType local_58;
  AllocatedData local_48;
  
  switch(this->writer->codec) {
  case UNCOMPRESSED:
    iVar3 = MemoryStream::GetPosition(temp_writer);
    *compressed_size = iVar3;
    pdVar5 = MemoryStream::GetData(temp_writer);
    goto LAB_01ba32cf;
  case SNAPPY:
    iVar3 = MemoryStream::GetPosition(temp_writer);
    sVar2 = duckdb_snappy::MaxCompressedLength(iVar3);
    *compressed_size = sVar2;
    pAVar4 = BufferAllocator::Get(this->writer->context);
    iVar3 = *compressed_size;
    pdVar5 = Allocator::AllocateData(pAVar4,iVar3);
    AllocatedData::AllocatedData((AllocatedData *)local_c8,pAVar4,pdVar5,iVar3);
    AllocatedData::operator=(compressed_buf,(AllocatedData *)local_c8);
    AllocatedData::~AllocatedData((AllocatedData *)local_c8);
    pdVar5 = MemoryStream::GetData(temp_writer);
    iVar3 = MemoryStream::GetPosition(temp_writer);
    duckdb_snappy::RawCompress((char *)pdVar5,iVar3,(char *)compressed_buf->pointer,compressed_size)
    ;
    break;
  case GZIP:
    local_68 = 0;
    mStack_60 = 0;
    local_78 = (void *)0x0;
    uStack_70._0_4_ = 0;
    uStack_70._4_4_ = 0;
    local_88 = (mz_alloc_func)0x0;
    p_Stack_80 = (mz_free_func)0x0;
    local_98 = (char *)0x0;
    pmStack_90 = (mz_internal_state *)0x0;
    local_a8._0_4_ = 0;
    local_a8._4_4_ = 0;
    mStack_a0 = 0;
    local_b8._M_allocated_capacity = 0;
    local_b8._8_8_ = (uchar *)0x0;
    local_c8._0_8_ = (Allocator *)0x0;
    local_c8._8_8_ = (data_ptr_t)0x0;
    local_58 = MINIZ_TYPE_NONE;
    iVar3 = MemoryStream::GetPosition(temp_writer);
    mVar8 = duckdb_miniz::mz_compressBound(iVar3);
    *compressed_size = mVar8 + 0x12;
    pAVar4 = BufferAllocator::Get(this->writer->context);
    iVar3 = *compressed_size;
    pdVar5 = Allocator::AllocateData(pAVar4,iVar3);
    AllocatedData::AllocatedData(&local_48,pAVar4,pdVar5,iVar3);
    AllocatedData::operator=(compressed_buf,&local_48);
    AllocatedData::~AllocatedData(&local_48);
    pdVar5 = MemoryStream::GetData(temp_writer);
    iVar3 = MemoryStream::GetPosition(temp_writer);
    MiniZStream::Compress
              ((MiniZStream *)local_c8,(char *)pdVar5,iVar3,(char *)compressed_buf->pointer,
               compressed_size);
    *compressed_data = compressed_buf->pointer;
    MiniZStream::~MiniZStream((MiniZStream *)local_c8);
    goto LAB_01ba32d7;
  default:
    pIVar9 = (InternalException *)__cxa_allocate_exception(0x10);
    local_c8._0_8_ = &local_b8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"Unsupported codec for Parquet Writer","");
    InternalException::InternalException(pIVar9,(string *)local_c8);
    __cxa_throw(pIVar9,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case BROTLI:
    iVar3 = MemoryStream::GetPosition(temp_writer);
    sVar2 = duckdb_brotli::BrotliEncoderMaxCompressedSize(iVar3);
    *compressed_size = sVar2;
    pAVar4 = BufferAllocator::Get(this->writer->context);
    iVar3 = *compressed_size;
    pdVar5 = Allocator::AllocateData(pAVar4,iVar3);
    AllocatedData::AllocatedData((AllocatedData *)local_c8,pAVar4,pdVar5,iVar3);
    AllocatedData::operator=(compressed_buf,(AllocatedData *)local_c8);
    AllocatedData::~AllocatedData((AllocatedData *)local_c8);
    iVar3 = MemoryStream::GetPosition(temp_writer);
    pdVar5 = MemoryStream::GetData(temp_writer);
    duckdb_brotli::BrotliEncoderCompress
              (0xb,0x16,BROTLI_MODE_GENERIC,iVar3,pdVar5,compressed_size,compressed_buf->pointer);
    break;
  case ZSTD:
    iVar3 = MemoryStream::GetPosition(temp_writer);
    sVar2 = duckdb_zstd::ZSTD_compressBound(iVar3);
    *compressed_size = sVar2;
    pAVar4 = BufferAllocator::Get(this->writer->context);
    iVar3 = *compressed_size;
    pdVar5 = Allocator::AllocateData(pAVar4,iVar3);
    AllocatedData::AllocatedData((AllocatedData *)local_c8,pAVar4,pdVar5,iVar3);
    AllocatedData::operator=(compressed_buf,(AllocatedData *)local_c8);
    AllocatedData::~AllocatedData((AllocatedData *)local_c8);
    pdVar5 = compressed_buf->pointer;
    sVar2 = *compressed_size;
    pdVar6 = MemoryStream::GetData(temp_writer);
    iVar3 = MemoryStream::GetPosition(temp_writer);
    uVar7 = duckdb_zstd::ZSTD_compress
                      (pdVar5,sVar2,pdVar6,iVar3,(int)this->writer->compression_level);
    goto LAB_01ba3140;
  case LZ4_RAW:
    iVar3 = MemoryStream::GetPosition(temp_writer);
    iVar1 = duckdb_lz4::LZ4_compressBound((int)iVar3);
    *compressed_size = (long)iVar1;
    pAVar4 = BufferAllocator::Get(this->writer->context);
    iVar3 = *compressed_size;
    pdVar5 = Allocator::AllocateData(pAVar4,iVar3);
    AllocatedData::AllocatedData((AllocatedData *)local_c8,pAVar4,pdVar5,iVar3);
    AllocatedData::operator=(compressed_buf,(AllocatedData *)local_c8);
    AllocatedData::~AllocatedData((AllocatedData *)local_c8);
    pdVar6 = MemoryStream::GetData(temp_writer);
    pdVar5 = compressed_buf->pointer;
    iVar3 = MemoryStream::GetPosition(temp_writer);
    iVar1 = duckdb_lz4::LZ4_compress_default
                      ((char *)pdVar6,(char *)pdVar5,(int)iVar3,(int)*compressed_size);
    uVar7 = (ulong)iVar1;
LAB_01ba3140:
    *compressed_size = uVar7;
    *compressed_data = compressed_buf->pointer;
    goto LAB_01ba32da;
  }
  pdVar5 = compressed_buf->pointer;
LAB_01ba32cf:
  *compressed_data = pdVar5;
LAB_01ba32d7:
  uVar7 = *compressed_size;
LAB_01ba32da:
  if (uVar7 >> 0x1f == 0) {
    return;
  }
  pIVar9 = (InternalException *)__cxa_allocate_exception(0x10);
  local_c8._0_8_ = &local_b8;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,
             "Parquet writer: %d compressed page size out of range for type integer","");
  iVar3 = MemoryStream::GetPosition(temp_writer);
  InternalException::InternalException<unsigned_long>(pIVar9,(string *)local_c8,iVar3);
  __cxa_throw(pIVar9,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ColumnWriter::CompressPage(MemoryStream &temp_writer, size_t &compressed_size, data_ptr_t &compressed_data,
                                AllocatedData &compressed_buf) {
	switch (writer.GetCodec()) {
	case CompressionCodec::UNCOMPRESSED:
		compressed_size = temp_writer.GetPosition();
		compressed_data = temp_writer.GetData();
		break;

	case CompressionCodec::SNAPPY: {
		compressed_size = duckdb_snappy::MaxCompressedLength(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		duckdb_snappy::RawCompress(const_char_ptr_cast(temp_writer.GetData()), temp_writer.GetPosition(),
		                           char_ptr_cast(compressed_buf.get()), &compressed_size);
		compressed_data = compressed_buf.get();
		D_ASSERT(compressed_size <= duckdb_snappy::MaxCompressedLength(temp_writer.GetPosition()));
		break;
	}
	case CompressionCodec::LZ4_RAW: {
		compressed_size = duckdb_lz4::LZ4_compressBound(UnsafeNumericCast<int32_t>(temp_writer.GetPosition()));
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		compressed_size = duckdb_lz4::LZ4_compress_default(
		    const_char_ptr_cast(temp_writer.GetData()), char_ptr_cast(compressed_buf.get()),
		    UnsafeNumericCast<int32_t>(temp_writer.GetPosition()), UnsafeNumericCast<int32_t>(compressed_size));
		compressed_data = compressed_buf.get();
		break;
	}
	case CompressionCodec::GZIP: {
		MiniZStream s;
		compressed_size = s.MaxCompressedLength(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		s.Compress(const_char_ptr_cast(temp_writer.GetData()), temp_writer.GetPosition(),
		           char_ptr_cast(compressed_buf.get()), &compressed_size);
		compressed_data = compressed_buf.get();
		break;
	}
	case CompressionCodec::ZSTD: {
		compressed_size = duckdb_zstd::ZSTD_compressBound(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		compressed_size = duckdb_zstd::ZSTD_compress((void *)compressed_buf.get(), compressed_size,
		                                             (const void *)temp_writer.GetData(), temp_writer.GetPosition(),
		                                             UnsafeNumericCast<int32_t>(writer.CompressionLevel()));
		compressed_data = compressed_buf.get();
		break;
	}
	case CompressionCodec::BROTLI: {
		compressed_size = duckdb_brotli::BrotliEncoderMaxCompressedSize(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		duckdb_brotli::BrotliEncoderCompress(BROTLI_DEFAULT_QUALITY, BROTLI_DEFAULT_WINDOW, BROTLI_DEFAULT_MODE,
		                                     temp_writer.GetPosition(), temp_writer.GetData(), &compressed_size,
		                                     compressed_buf.get());
		compressed_data = compressed_buf.get();
		break;
	}
	default:
		throw InternalException("Unsupported codec for Parquet Writer");
	}

	if (compressed_size > idx_t(NumericLimits<int32_t>::Maximum())) {
		throw InternalException("Parquet writer: %d compressed page size out of range for type integer",
		                        temp_writer.GetPosition());
	}
}